

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::InsertCompileOption
          (cmTarget *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *entry,bool before)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  pointer pcVar3;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58;
  
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  paVar1 = &local_58.Value.field_2;
  pcVar3 = (entry->Value)._M_dataplus._M_p;
  local_58.Value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (entry->Value)._M_string_length);
  local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (entry->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (entry->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  anon_unknown.dwarf_2161607::UsageRequirementProperty::WriteDirect
            (&(_Var2._M_head_impl)->CompileOptions,&local_58,Append - before);
  if (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.Value._M_dataplus._M_p,local_58.Value.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void cmTarget::InsertCompileOption(BT<std::string> const& entry, bool before)
{
  this->impl->CompileOptions.WriteDirect(
    entry,
    before ? UsageRequirementProperty::Action::Prepend
           : UsageRequirementProperty::Action::Append);
}